

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O0

StringView CpuFeatures_StringView_TrimWhitespace(StringView view)

{
  ushort *puVar1;
  StringView str_view;
  StringView str_view_00;
  StringView view_00;
  StringView SVar2;
  char cVar3;
  ushort **ppuVar4;
  size_t in_RSI;
  char *in_RDI;
  bool bVar5;
  StringView SVar6;
  ushort *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t sStack_20;
  
  local_28 = in_RDI;
  sStack_20 = in_RSI;
  while( true ) {
    bVar5 = false;
    if (sStack_20 != 0) {
      ppuVar4 = __ctype_b_loc();
      puVar1 = *ppuVar4;
      SVar6.size = sStack_20;
      SVar6.ptr = local_28;
      cVar3 = CpuFeatures_StringView_Front(SVar6);
      bVar5 = (puVar1[(int)cVar3] & 0x2000) != 0;
    }
    if (!bVar5) break;
    str_view.size._0_7_ = in_stack_ffffffffffffffa0;
    str_view.ptr = (char *)in_stack_ffffffffffffff98;
    str_view.size._7_1_ = in_stack_ffffffffffffffa7;
    SVar6 = CpuFeatures_StringView_PopFront(str_view,0x107d56);
    local_38 = SVar6.ptr;
    local_28 = local_38;
    local_30 = SVar6.size;
    sStack_20 = local_30;
  }
  while( true ) {
    bVar5 = false;
    if (sStack_20 != 0) {
      ppuVar4 = __ctype_b_loc();
      in_stack_ffffffffffffff98 = *ppuVar4;
      view_00.size = sStack_20;
      view_00.ptr = local_28;
      cVar3 = CpuFeatures_StringView_Back(view_00);
      bVar5 = (in_stack_ffffffffffffff98[(int)cVar3] & 0x2000) != 0;
    }
    if (bVar5 == false) break;
    str_view_00.size._0_7_ = in_stack_ffffffffffffffa0;
    str_view_00.ptr = (char *)in_stack_ffffffffffffff98;
    str_view_00.size._7_1_ = bVar5;
    SVar6 = CpuFeatures_StringView_PopBack(str_view_00,0x107de1);
    local_48 = SVar6.ptr;
    local_28 = local_48;
    local_40 = SVar6.size;
    sStack_20 = local_40;
  }
  SVar2.size = sStack_20;
  SVar2.ptr = local_28;
  return SVar2;
}

Assistant:

StringView CpuFeatures_StringView_TrimWhitespace(StringView view) {
  while (view.size && isspace(CpuFeatures_StringView_Front(view)))
    view = CpuFeatures_StringView_PopFront(view, 1);
  while (view.size && isspace(CpuFeatures_StringView_Back(view)))
    view = CpuFeatures_StringView_PopBack(view, 1);
  return view;
}